

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDatum.hh
# Opt level: O2

void __thiscall avro::GenericDatum::GenericDatum(GenericDatum *this,GenericDatum *param_1)

{
  int iVar1;
  undefined4 extraout_var;
  placeholder *ppVar2;
  
  this->type_ = param_1->type_;
  ppVar2 = (param_1->value_).content;
  if (ppVar2 == (placeholder *)0x0) {
    ppVar2 = (placeholder *)0x0;
  }
  else {
    iVar1 = (*ppVar2->_vptr_placeholder[3])();
    ppVar2 = (placeholder *)CONCAT44(extraout_var,iVar1);
  }
  (this->value_).content = ppVar2;
  return;
}

Assistant:

class AVRO_DECL GenericDatum {
    Type type_;
    boost::any value_;

    GenericDatum(Type t) : type_(t) { }

    template <typename T>
    GenericDatum(Type t, const T& v) : type_(t), value_(v) { }

    void init(const NodePtr& schema);
public:
    /**
     * The avro data type this datum holds.
     */
    Type type() const {
        return type_;
    }

    /**
     * Returns the value held by this datum.
     * T The type for the value. This must correspond to the
     * avro type returned by type().
     */
    template<typename T> const T& value() const {
        return *boost::any_cast<T>(&value_);
    }

    /**
     * Returns the reference to the value held by this datum, which
     * can be used to change the contents. Please note that only
     * value can be changed, the data type of the value held cannot
     * be changed.
     *
     * T The type for the value. This must correspond to the
     * avro type returned by type().
     */
    template<typename T> T& value() {
        return *boost::any_cast<T>(&value_);
    }

    /**
     * Returns true if and only if this datum is a union.
     */
    bool isUnion() const { return type_ == AVRO_UNION; }

    /**
     * Returns the index of the current branch, if this is a union.
     * \sa isUnion().
     */
    size_t unionBranch() const;

    /**
     * Selects a new branch in the union if this is a union.
     * \sa isUnion().
     */
    void selectBranch(size_t branch);

    /// Makes a new AVRO_NULL datum.
    GenericDatum() : type_(AVRO_NULL) { }

    /// Makes a new AVRO_BOOL datum whose value is of type bool.
    GenericDatum(bool v) : type_(AVRO_BOOL), value_(v) { }

    /// Makes a new AVRO_INT datum whose value is of type int32_t.
    GenericDatum(int32_t v) : type_(AVRO_INT), value_(v) { }

    /// Makes a new AVRO_LONG datum whose value is of type int64_t.
    GenericDatum(int64_t v) : type_(AVRO_LONG), value_(v) { }

    /// Makes a new AVRO_FLOAT datum whose value is of type float.
    GenericDatum(float v) : type_(AVRO_FLOAT), value_(v) { }

    /// Makes a new AVRO_DOUBLE datum whose value is of type double.
    GenericDatum(double v) : type_(AVRO_DOUBLE), value_(v) { }

    /// Makes a new AVRO_STRING datum whose value is of type std::string.
    GenericDatum(const std::string& v) : type_(AVRO_STRING), value_(v) { }

    /// Makes a new AVRO_BYTES datum whose value is of type
    /// std::vector<uint8_t>.
    GenericDatum(const std::vector<uint8_t>& v) :
        type_(AVRO_BYTES), value_(v) { }

    /**
     * Constructs a datum corresponding to the given avro type.
     * The value will the appropraite default corresponding to the
     * data type.
     * \param schema The schema that defines the avro type.
     */
    GenericDatum(const NodePtr& schema);

    /**
     * Constructs a datum corresponding to the given avro type and set
     * the value. 
     * \param schema The schema that defines the avro type.
     * \param v The value for this type.
     */
    template<typename T>
    GenericDatum(const NodePtr& schema, const T& v) :
        type_(schema->type()) {
        init(schema);
        value<T>() = v;
    }

    /**
     * Constructs a datum corresponding to the given avro type.
     * The value will the appropraite default corresponding to the
     * data type.
     * \param schema The schema that defines the avro type.
     */
    GenericDatum(const ValidSchema& schema);
}